

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall slang::parsing::Parser::isVariableDeclaration(Parser *this)

{
  uint32_t uVar1;
  bool bVar2;
  TokenKind TVar3;
  uint uVar4;
  ulong uVar5;
  Token TVar6;
  uint32_t local_1c;
  
  local_1c = 0;
  bVar2 = scanAttributes(this,&local_1c);
  uVar1 = local_1c;
  if (bVar2) {
    TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c);
    TVar3 = TVar6.kind;
    uVar5 = (ulong)(TVar3 - 0xea);
    if (TVar3 - 0xea < 0x38) {
      if ((0x8060000b00000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0034d1dc;
      if ((0x80000000000001U >> (uVar5 & 0x3f) & 1) != 0) {
        return true;
      }
      if (uVar5 == 0x32) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
        TVar3 = TVar6.kind;
        if (TVar3 == ConstraintKeyword) {
          return false;
        }
        if (TVar3 == FunctionKeyword) {
          return false;
        }
        if (TVar3 == TaskKeyword) {
          return false;
        }
        return true;
      }
    }
    uVar4 = TVar3 - 0xbd;
    if (uVar4 < 0x20) {
      if ((0xc00300U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0034d1dc;
      if ((0x80220000U >> (uVar4 & 0x1f) & 1) != 0) {
        return true;
      }
      if (uVar4 == 0) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
        bVar2 = TVar6.kind == StringLiteral;
        goto LAB_0034d1d3;
      }
    }
    uVar4 = TVar3 - 0x67;
    if (uVar4 < 0x3c) {
      if ((0xc00000000010001U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
        return true;
      }
      if ((0x400840UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_0034d1dc;
    }
    if (TVar3 - 0x139 < 2) {
      return true;
    }
    if (TVar3 == TimeKeyword) {
LAB_0034d1dc:
      TVar6 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
      return (ushort)(TVar6.kind - OpenBrace) < 0xfffe;
    }
    if (TVar3 == TypeKeyword) {
      TVar6 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
      if (TVar6.kind == OpenParenthesis) {
        local_1c = uVar1 + 2;
        bVar2 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          (this,&local_1c,OpenParenthesis,CloseParenthesis);
        if (bVar2) goto LAB_0034d22e;
      }
    }
    else {
      if (TVar3 == VarKeyword) {
        return true;
      }
      if (TVar3 == VirtualKeyword) {
        local_1c = uVar1 + 1;
        TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c);
        if (TVar6.kind == InterfaceKeyword) {
          return true;
        }
        bVar2 = scanQualifiedName(this,&local_1c,false);
        if (!bVar2) {
          return false;
        }
        TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c);
        if (TVar6.kind == Dot) {
          return true;
        }
LAB_0034d22e:
        TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c);
        return TVar6.kind == Identifier;
      }
      bVar2 = scanQualifiedName(this,&local_1c,false);
      if (!bVar2) {
        return false;
      }
      bVar2 = scanDimensionList(this,&local_1c);
      if ((bVar2) &&
         (TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c), TVar6.kind == Identifier)) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,local_1c + 1);
        bVar2 = TVar6.kind == OpenParenthesis;
LAB_0034d1d3:
        return !bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Parser::isVariableDeclaration() {
    uint32_t index = 0;
    if (!scanAttributes(index))
        return false;

    // decide whether a statement is a declaration or the start of an expression
    auto kind = peek(index).kind;
    switch (kind) {
        // some tokens unambiguously start a declaration
        case TokenKind::VarKeyword:
        case TokenKind::AutomaticKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::TypedefKeyword:
        case TokenKind::NetTypeKeyword:
        case TokenKind::LocalParamKeyword:
        case TokenKind::ParameterKeyword:
        case TokenKind::LetKeyword:
            return true;

        // Static keyword *should* always be a variable, but it could accidentally
        // be an attempt at an out-of-block function declaration, or it could legitimately
        // be an out-of-block constraint declaration.
        case TokenKind::StaticKeyword: {
            auto next = peek(index + 1);
            return next.kind != TokenKind::FunctionKeyword && next.kind != TokenKind::TaskKeyword &&
                   next.kind != TokenKind::ConstraintKeyword;
        }

        // either an import of a package or a DPI import
        case TokenKind::ImportKeyword:
            return peek(index + 1).kind != TokenKind::StringLiteral;

        // this could be a virtual interface, a virtual class declaration, or a virtual function
        case TokenKind::VirtualKeyword:
            if (peek(++index).kind == TokenKind::InterfaceKeyword)
                return true;
            if (!scanQualifiedName(index, /* allowNew */ false))
                return false;
            if (peek(index).kind == TokenKind::Dot)
                return true;
            return peek(index).kind == TokenKind::Identifier;

        // some cases might be a cast expression
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword: {
            auto next = peek(++index).kind;
            return next != TokenKind::Apostrophe && next != TokenKind::ApostropheOpenBrace;
        }

        // if this is the type operator it's technically not allowed to be a variable
        // declaration without a "var" prefix, but we'll try to allow it anyway and
        // diagnose it later with a better error message.
        case TokenKind::TypeKeyword: {
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
            return peek(index).kind == TokenKind::Identifier;
        }

        default:
            break;
    }

    if (!scanQualifiedName(index, /* allowNew */ false))
        return false;

    // might be a list of dimensions here
    if (!scanDimensionList(index))
        return false;

    // next token is the decider; declarations must have an identifier here
    // and there can't be an open parenthesis right after it.
    return peek(index).kind == TokenKind::Identifier &&
           peek(index + 1).kind != TokenKind::OpenParenthesis;
}